

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

parasail_sequences_t * parasail_sequences_from_file(char *filename)

{
  kstring_t *str;
  byte bVar1;
  undefined8 *__ptr;
  double dVar2;
  kstring_t *pkVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  parasail_sequences_t *ppVar7;
  int *piVar8;
  kstring_t *str_00;
  kstream_t *ks;
  uchar *puVar9;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  parasail_sequence_t *ppVar14;
  int iVar15;
  undefined4 uVar16;
  ulong __size;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  size_t sVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint local_cc;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  parasail_sequences_t *local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  parasail_sequence_t *local_80;
  ulong local_78;
  kstring_t *local_70;
  ulong local_68;
  size_t local_60;
  double local_58;
  undefined8 uStack_50;
  FILE *local_40;
  kstring_t *local_38;
  
  ppVar7 = (parasail_sequences_t *)malloc(0x30);
  if (ppVar7 == (parasail_sequences_t *)0x0) {
    parasail_sequences_from_file_cold_4();
    return (parasail_sequences_t *)0x0;
  }
  local_80 = (parasail_sequence_t *)malloc(64000);
  if (local_80 == (parasail_sequence_t *)0x0) {
    parasail_sequences_from_file_cold_3();
    return (parasail_sequences_t *)0x0;
  }
  iVar4 = strncmp("stdin",filename,5);
  local_40 = _stdin;
  if (iVar4 != 0) {
    piVar8 = __errno_location();
    *piVar8 = 0;
    local_40 = fopen(filename,"r");
    if (local_40 == (FILE *)0x0) {
      parasail_sequences_from_file_cold_1();
      return (parasail_sequences_t *)0x0;
    }
  }
  local_b0 = ppVar7;
  iVar5 = fileno(local_40);
  str_00 = (kstring_t *)calloc(1,0x70);
  ks = (kstream_t *)calloc(1,0x18);
  ks->f = iVar5;
  puVar9 = (uchar *)malloc(0x4000);
  ks->buf = puVar9;
  str_00[4].m = (size_t)ks;
  str = str_00 + 3;
  local_70 = str_00 + 2;
  local_38 = str_00 + 1;
  local_68 = 1000;
  local_c8._0_4_ = 0;
  local_c8._4_4_ = 0;
  uStack_c0 = 0;
  uStack_bc = 0;
  local_58 = 0.0;
  uStack_50 = 0;
  iVar5 = 0;
  local_a8 = 0.0;
  local_98 = 0.0;
  local_60 = 0;
  uVar17 = 0;
  do {
    uStack_90 = 0;
    uStack_a0 = 0;
    if (iVar5 == 0) {
      uVar11 = (ulong)(uint)ks->end;
      uVar21 = (undefined4)local_c8;
      uVar22 = local_c8._4_4_;
      uVar23 = uStack_c0;
      uVar24 = uStack_bc;
      do {
        iVar5 = (int)uVar11;
        if ((iVar5 == -1) || ((iVar15 = ks->begin, ks->is_eof != 0 && (iVar5 <= iVar15))))
        goto LAB_004b5aad;
        puVar9 = ks->buf;
        if (iVar5 <= iVar15) {
          ks->begin = 0;
          uVar11 = read(ks->f,puVar9,0x4000);
          ks->end = (int)uVar11;
          if ((int)uVar11 + 1U < 2) goto LAB_004b5aa6;
          iVar15 = ks->begin;
          puVar9 = ks->buf;
          uVar21 = (undefined4)local_c8;
          uVar22 = local_c8._4_4_;
          uVar23 = uStack_c0;
          uVar24 = uStack_bc;
        }
        ks->begin = iVar15 + 1;
        bVar1 = puVar9[iVar15];
        local_cc = (uint)bVar1;
      } while ((local_cc != 0x40) && (bVar1 != 0x3e));
      *(uint *)&str_00[4].l = (uint)bVar1;
    }
    str_00[3].l = 0;
    str_00[2].l = 0;
    str_00[1].l = 0;
    iVar5 = ks_getuntil2(ks,0,str_00,(int *)&local_cc,0);
    if (iVar5 < 0) {
LAB_004b5c10:
      uVar16 = 0;
LAB_004b5c15:
      uVar11 = uVar17;
      uVar21 = (undefined4)local_c8;
      uVar22 = local_c8._4_4_;
      uVar23 = uStack_c0;
      uVar24 = uStack_bc;
      goto LAB_004b5ac0;
    }
    if (local_cc != 10) {
      ks_getuntil2(ks,2,local_38,(int *)0x0,0);
    }
    if (str_00[2].s == (char *)0x0) {
      str_00[2].m = 0x100;
      pcVar10 = (char *)malloc(0x100);
      str_00[2].s = pcVar10;
    }
    pkVar3 = local_70;
    uVar6 = ks->end;
    uVar11 = (ulong)uVar6;
    while (uVar19 = 0xfffffffd, uVar6 != 0xffffffff) {
      iVar5 = ks->begin;
      if ((ks->is_eof != 0) && ((int)uVar11 <= iVar5)) {
        uVar19 = 0xffffffff;
        break;
      }
      puVar9 = ks->buf;
      if ((int)uVar11 <= iVar5) {
        ks->begin = 0;
        uVar11 = read(ks->f,puVar9,0x4000);
        iVar5 = (int)uVar11;
        ks->end = iVar5;
        if (iVar5 == -1) {
          uVar19 = 0xfffffffd;
        }
        else {
          if (iVar5 != 0) {
            iVar5 = ks->begin;
            puVar9 = ks->buf;
            goto LAB_004b5634;
          }
          uVar19 = 0xffffffff;
        }
        ks->is_eof = 1;
        break;
      }
LAB_004b5634:
      ks->begin = iVar5 + 1;
      bVar1 = puVar9[iVar5];
      local_cc = (uint)bVar1;
      uVar6 = (uint)bVar1;
      if (local_cc < 0x2b) {
        if (uVar6 != 10) goto LAB_004b566e;
      }
      else {
        uVar19 = local_cc;
        if (uVar6 == 0x2b) break;
        if ((uVar6 == 0x3e) || (uVar6 == 0x40)) {
          *(uint *)&str_00[4].l = uVar6;
          break;
        }
LAB_004b566e:
        sVar20 = str_00[2].l;
        str_00[2].l = sVar20 + 1;
        str_00[2].s[sVar20] = bVar1;
        ks_getuntil2(ks,2,pkVar3,(int *)0x0,1);
        uVar11 = (ulong)(uint)ks->end;
      }
      uVar6 = (uint)uVar11;
    }
    local_cc = uVar19;
    sVar20 = str_00[2].l;
    __size = str_00[2].m;
    uVar11 = sVar20 + 1;
    pcVar10 = str_00[2].s;
    if (__size <= uVar11) {
      uVar11 = uVar11 >> 1 | uVar11;
      uVar11 = uVar11 >> 2 | uVar11;
      uVar11 = uVar11 >> 4 | uVar11;
      uVar11 = uVar11 >> 8 | uVar11;
      __size = (uVar11 >> 0x10 | uVar11) + 1;
      str_00[2].m = __size;
      pcVar10 = (char *)realloc(pcVar10,__size);
      str_00[2].s = pcVar10;
    }
    pcVar10[sVar20] = '\0';
    if (local_cc == 0x2b) {
      if (str_00[3].m < __size) {
        str_00[3].m = __size;
        pcVar10 = (char *)realloc(str_00[3].s,__size);
        str_00[3].s = pcVar10;
      }
      pkVar3 = local_70;
      uVar11 = (ulong)(uint)ks->end;
      uVar21 = (undefined4)local_c8;
      uVar22 = local_c8._4_4_;
      uVar23 = uStack_c0;
      uVar24 = uStack_bc;
      do {
        iVar5 = (int)uVar11;
        if (iVar5 == -1) {
LAB_004b5851:
          local_cc = 0xfffffffd;
          break;
        }
        iVar15 = ks->begin;
        if ((ks->is_eof != 0) && (iVar5 <= iVar15)) goto LAB_004b5aad;
        puVar9 = ks->buf;
        if (iVar5 <= iVar15) {
          ks->begin = 0;
          uVar11 = read(ks->f,puVar9,0x4000);
          iVar5 = (int)uVar11;
          ks->end = iVar5;
          if (iVar5 == -1) {
            ks->is_eof = 1;
            goto LAB_004b5851;
          }
          if (iVar5 == 0) goto LAB_004b5aa6;
          iVar15 = ks->begin;
          puVar9 = ks->buf;
          uVar21 = (undefined4)local_c8;
          uVar22 = local_c8._4_4_;
          uVar23 = uStack_c0;
          uVar24 = uStack_bc;
        }
        ks->begin = iVar15 + 1;
        local_cc = (uint)puVar9[iVar15];
      } while (local_cc != 10);
      do {
        iVar5 = ks_getuntil2(ks,2,str,(int *)0x0,1);
        if (iVar5 < 0) {
          sVar12 = pkVar3->l;
          sVar20 = str->l;
          break;
        }
        sVar20 = str->l;
        sVar12 = pkVar3->l;
        local_cc = (uint)(sVar20 < sVar12);
      } while (sVar20 < sVar12);
      *(undefined4 *)&str_00[4].l = 0;
      if (sVar12 != sVar20) goto LAB_004b5c10;
    }
    if ((int)sVar20 < 0) goto LAB_004b5c10;
    piVar8 = __errno_location();
    ppVar14 = local_80;
    *piVar8 = 0;
    sVar12 = str_00->l;
    local_80[uVar17].name.l = sVar12;
    sVar13 = str_00[1].l;
    local_80[uVar17].comment.l = sVar13;
    local_80[uVar17].seq.l = sVar20;
    local_80[uVar17].qual.l = str_00[3].l;
    local_80[uVar17].name.s = (char *)0x0;
    local_80[uVar17].comment.s = (char *)0x0;
    local_80[uVar17].seq.s = (char *)0x0;
    local_80[uVar17].qual.s = (char *)0x0;
    auVar27._8_4_ = (int)(sVar20 >> 0x20);
    auVar27._0_8_ = sVar20;
    auVar27._12_4_ = 0x45300000;
    dVar2 = (auVar27._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar20) - 4503599627370496.0);
    dVar28 = dVar2;
    dVar25 = dVar2;
    if (uVar17 != 0) {
      dVar28 = local_a8;
      if (dVar2 <= local_a8) {
        dVar28 = dVar2;
      }
      dVar25 = local_98;
      if (local_98 <= dVar2) {
        dVar25 = dVar2;
      }
    }
    uVar11 = uVar17 + 1;
    dVar26 = dVar2 - local_58;
    auVar29._8_4_ = (int)(uVar11 >> 0x20);
    auVar29._0_8_ = uVar11;
    auVar29._12_4_ = 0x45300000;
    local_58 = local_58 +
               dVar26 / ((auVar29._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0));
    local_c8 = local_c8 + (dVar2 - local_58) * dVar26;
    local_60 = local_60 + sVar20;
    local_a8 = dVar28;
    local_98 = dVar25;
    local_78 = uVar17;
    if (sVar12 != 0) {
      pcVar10 = strdup_rpl(str_00->s);
      ppVar14[uVar17].name.s = pcVar10;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "strdup name";
        goto LAB_004b5c75;
      }
      sVar13 = ppVar14[uVar17].comment.l;
    }
    if (sVar13 != 0) {
      pcVar10 = strdup_rpl(str_00[1].s);
      ppVar14[uVar17].comment.s = pcVar10;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "strdup comment";
        goto LAB_004b5c75;
      }
    }
    if (ppVar14[uVar17].seq.l != 0) {
      pcVar10 = strdup_rpl(str_00[2].s);
      ppVar14[uVar17].seq.s = pcVar10;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "strdup seq";
        goto LAB_004b5c75;
      }
    }
    if (ppVar14[uVar17].qual.l != 0) {
      pcVar10 = strdup_rpl(str_00[3].s);
      ppVar14[uVar17].qual.s = pcVar10;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "strdup qual";
LAB_004b5c75:
        perror(pcVar10);
        uVar16 = 1;
        uStack_90 = 0;
        uStack_a0 = 0;
        uVar17 = uVar11;
        uVar11 = local_78;
        uVar21 = (undefined4)local_c8;
        uVar22 = local_c8._4_4_;
        uVar23 = uStack_c0;
        uVar24 = uStack_bc;
LAB_004b5ac0:
        ppVar7 = local_b0;
        local_70 = (kstring_t *)CONCAT44(local_70._4_4_,uVar16);
        local_c8 = (double)CONCAT44(uVar22,uVar21);
        uStack_c0 = uVar23;
        uStack_bc = uVar24;
        free(str_00->s);
        free(str_00[1].s);
        free(str_00[2].s);
        free(str_00[3].s);
        __ptr = (undefined8 *)str_00[4].m;
        if (__ptr != (undefined8 *)0x0) {
          free((void *)*__ptr);
          free(__ptr);
        }
        free(str_00);
        uVar21 = (undefined4)local_c8;
        uVar22 = local_c8._4_4_;
        uVar23 = uStack_c0;
        uVar24 = uStack_bc;
        iVar5 = (int)local_70;
LAB_004b5b1f:
        if (iVar4 != 0) {
          local_c8 = (double)CONCAT44(uVar22,uVar21);
          uStack_c0 = uVar23;
          uStack_bc = uVar24;
          fclose(local_40);
          uVar21 = (undefined4)local_c8;
          uVar22 = local_c8._4_4_;
        }
        ppVar7->seqs = local_80;
        ppVar7->l = uVar11;
        ppVar7->characters = local_60;
        ppVar7->shortest =
             (long)local_a8 >> 0x3f & (long)(local_a8 - 9.223372036854776e+18) | (long)local_a8;
        lVar18 = uVar17 - 1;
        auVar30._8_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar30._0_8_ = lVar18;
        auVar30._12_4_ = 0x45300000;
        ppVar7->longest =
             (long)local_98 >> 0x3f & (long)(local_98 - 9.223372036854776e+18) | (long)local_98;
        dVar2 = (double)CONCAT44(uVar22,uVar21) /
                ((auVar30._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0));
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        ppVar7->mean = (float)local_58;
        ppVar7->stddev = (float)dVar2;
        if (iVar5 != 0) {
          parasail_sequences_from_file_cold_2();
          return (parasail_sequences_t *)0x0;
        }
        return ppVar7;
      }
    }
    uVar17 = local_68;
    if (local_68 <= uVar11) {
      *piVar8 = 0;
      ppVar14 = (parasail_sequence_t *)realloc(local_80,local_68 << 7);
      if (ppVar14 != (parasail_sequence_t *)0x0) {
        local_68 = uVar17 * 2;
        *piVar8 = 0;
        local_80 = ppVar14;
        goto LAB_004b5a74;
      }
      perror("realloc");
      uVar16 = 2;
      uStack_90 = 0;
      uStack_a0 = 0;
      uVar17 = uVar11;
      goto LAB_004b5c15;
    }
LAB_004b5a74:
    ks = (kstream_t *)str_00[4].m;
    iVar5 = (int)str_00[4].l;
    uVar17 = uVar11;
  } while( true );
LAB_004b5aa6:
  ks->is_eof = 1;
  uVar21 = (undefined4)local_c8;
  uVar22 = local_c8._4_4_;
  uVar23 = uStack_c0;
  uVar24 = uStack_bc;
LAB_004b5aad:
  iVar5 = 0;
  uVar16 = 0;
  ppVar7 = local_b0;
  uVar11 = uVar17;
  if (str_00 != (kstring_t *)0x0) goto LAB_004b5ac0;
  goto LAB_004b5b1f;
}

Assistant:

parasail_sequences_t* parasail_sequences_from_file(const char *filename)
{
#if HAVE_ZLIB
    gzFile fp;
#else
    FILE* fp;
    int is_stdin = 0;
#endif
    kseq_t *seq = NULL;
    int l = 0;
    parasail_sequences_t *retval = NULL;
    parasail_sequence_t *sequences = NULL;
    unsigned long count = 0;
    unsigned long capacity = 1000;
    size_t chars = 0;
    stats_t stats;
    int error_during_kseq = 0;

    stats_clear(&stats);

    retval = (parasail_sequences_t*)malloc(sizeof(parasail_sequences_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        return NULL;
    }
    sequences = (parasail_sequence_t*)malloc(sizeof(parasail_sequence_t) * capacity);
    if (NULL == sequences) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        free(retval);
        return NULL;
    }

    /* check for stdin instead of a normal filename */
    if (0 == strncmp("stdin", filename, 5)) {
#if HAVE_ZLIB
        fp = gzdopen(fileno(stdin), "r");
        if (fp == Z_NULL) {
            perror("gzdopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = stdin;
        is_stdin = 1;
#endif
    }
    else {
        /* open the file */
        errno = 0;
#if HAVE_ZLIB
        fp = gzopen(filename, "r");
        if (fp == Z_NULL) {
            perror("gzopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = fopen(filename, "r");
        if (fp == NULL) {
            perror("fopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#endif
    }
    
    /* initialize kseq structures */
#if HAVE_ZLIB
    seq = kseq_init(fp);
#else
    seq = kseq_init(fileno(fp));
#endif

    /* parse file */
    while ((l = kseq_read(seq)) >= 0) {
        errno = 0;
        sequences[count].name.l = seq->name.l;
        sequences[count].comment.l = seq->comment.l;
        sequences[count].seq.l = seq->seq.l;
        sequences[count].qual.l = seq->qual.l;
        sequences[count].name.s = NULL;
        sequences[count].comment.s = NULL;
        sequences[count].seq.s = NULL;
        sequences[count].qual.s = NULL;

        stats_sample_value(&stats, seq->seq.l);
        chars += seq->seq.l;

        if (sequences[count].name.l) {
            sequences[count].name.s = strdup_rpl(seq->name.s);
            if (NULL == sequences[count].name.s) {
                perror("strdup name");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].comment.l) {
            sequences[count].comment.s = strdup_rpl(seq->comment.s);
            if (NULL == sequences[count].comment.s) {
                perror("strdup comment");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].seq.l) {
            sequences[count].seq.s = strdup_rpl(seq->seq.s);
            if (NULL == sequences[count].seq.s) {
                perror("strdup seq");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].qual.l) {
            sequences[count].qual.s = strdup_rpl(seq->qual.s);
            if (NULL == sequences[count].qual.s) {
                perror("strdup qual");
                error_during_kseq = 1;
                break;
            }
        }
        ++count;

        /* allocate more space for sequences if we ran out */
        if (count >= capacity) {
            parasail_sequence_t *new_sequences = NULL;
            capacity *= 2;
            errno = 0;
            new_sequences = (parasail_sequence_t*)realloc(sequences, sizeof(parasail_sequence_t) * capacity);
            if (NULL == new_sequences) {
                perror("realloc");
                error_during_kseq = 2;
                break;
            }
            sequences = new_sequences;
            errno = 0;
        }
    }
    kseq_destroy(seq);
#if HAVE_ZLIB
    gzclose(fp);
#else
    if (!is_stdin) {
        fclose(fp);
    }
#endif

    retval->seqs = sequences;
    retval->l = count;
    retval->characters = chars;
    retval->shortest = stats._min;
    retval->longest = stats._max;
    retval->mean = stats._mean;
    retval->stddev = stats_stddev(&stats);

    if (0 != error_during_kseq) {
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        if (1 == error_during_kseq) {
            retval->l++;
        }
        parasail_sequences_free(retval);
        return NULL;
    }

    return retval;
}